

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
          (Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *__return_storage_ptr__
          ,Generators *this,unary_op_tuple<trng::optimized_impl::uint128,_float> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators_1)

{
  IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
  local_28;
  
  local_28._M_head_impl = in_RAX;
  value<unary_op_tuple<trng::optimized_impl::uint128,float>>
            ((Generators *)&local_28,(unary_op_tuple<trng::optimized_impl::uint128,_float> *)this);
  Generators<unary_op_tuple<trng::optimized_impl::uint128,float>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,float>>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
            ((Generators<unary_op_tuple<trng::optimized_impl::uint128,float>> *)
             __return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *)&local_28,
             val,moreGenerators);
  if (local_28._M_head_impl !=
      (IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *)0x0) {
    (*((local_28._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }